

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseTypeFromProtoType(Parser *this,Type *type)

{
  bool bVar1;
  BaseType *in_RDX;
  type_lookup *local_28;
  type_lookup *tl;
  Type *type_local;
  Parser *this_local;
  CheckedError *ce;
  
  for (local_28 = ParseTypeFromProtoType::lookup; local_28->proto_type != (char *)0x0;
      local_28 = local_28 + 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &type[1].struct_def,local_28->proto_type);
    if (bVar1) {
      *in_RDX = local_28->fb_type;
      in_RDX[1] = local_28->element;
      Next(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (!bVar1) {
        CheckedError::~CheckedError((CheckedError *)this);
        anon_unknown_0::NoError();
      }
      goto LAB_0012f3ac;
    }
  }
  bVar1 = Is((Parser *)type,0x2e);
  if (bVar1) {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_0012f3ac;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  ParseTypeIdent(this,type);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    anon_unknown_0::NoError();
  }
LAB_0012f3ac:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTypeFromProtoType(Type *type) {
  struct type_lookup {
    const char *proto_type;
    BaseType fb_type, element;
  };
  static type_lookup lookup[] = {
    { "float", BASE_TYPE_FLOAT, BASE_TYPE_NONE },
    { "double", BASE_TYPE_DOUBLE, BASE_TYPE_NONE },
    { "int32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "int64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "uint32", BASE_TYPE_UINT, BASE_TYPE_NONE },
    { "uint64", BASE_TYPE_ULONG, BASE_TYPE_NONE },
    { "sint32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "sint64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "fixed32", BASE_TYPE_UINT, BASE_TYPE_NONE },
    { "fixed64", BASE_TYPE_ULONG, BASE_TYPE_NONE },
    { "sfixed32", BASE_TYPE_INT, BASE_TYPE_NONE },
    { "sfixed64", BASE_TYPE_LONG, BASE_TYPE_NONE },
    { "bool", BASE_TYPE_BOOL, BASE_TYPE_NONE },
    { "string", BASE_TYPE_STRING, BASE_TYPE_NONE },
    { "bytes", BASE_TYPE_VECTOR, BASE_TYPE_UCHAR },
    { nullptr, BASE_TYPE_NONE, BASE_TYPE_NONE }
  };
  for (auto tl = lookup; tl->proto_type; tl++) {
    if (attribute_ == tl->proto_type) {
      type->base_type = tl->fb_type;
      type->element = tl->element;
      NEXT();
      return NoError();
    }
  }
  if (Is('.')) NEXT();  // qualified names may start with a . ?
  ECHECK(ParseTypeIdent(*type));
  return NoError();
}